

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

bool image_match::check_magic_number(path *filepath)

{
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  source_loc loc_03;
  byte bVar1;
  int iVar2;
  logger *plVar3;
  long *plVar4;
  source_loc local_328;
  source_loc local_310;
  source_loc local_2f8;
  source_loc local_2e0;
  string local_2c8;
  char local_2a4;
  char local_2a3;
  uint8_t buff [8];
  long local_278;
  ifstream input_file;
  string local_60;
  string_view_t local_40;
  source_loc local_30;
  path *local_18;
  path *filepath_local;
  
  local_18 = (path *)filepath;
  plVar3 = spdlog::default_logger_raw();
  spdlog::source_loc::source_loc
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
             ,0x76,"check_magic_number");
  ::fmt::v7::basic_string_view<char>::basic_string_view(&local_40,"Checking magic number for {}");
  CLI::std::filesystem::__cxx11::path::string(&local_60,local_18);
  loc.line = local_30.line;
  loc._12_4_ = local_30._12_4_;
  loc.filename = local_30.filename;
  loc.funcname = local_30.funcname;
  spdlog::logger::log<std::__cxx11::string>(plVar3,loc,debug,local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ifstream *)&local_278,local_18,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)&local_278 + *(long *)(local_278 + -0x18)));
  if ((bVar1 & 1) == 0) {
    plVar4 = (long *)std::istream::read((char *)&local_278,(long)&local_2a4);
    bVar1 = std::ios::operator!((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if ((bVar1 & 1) == 0) {
      if (local_2a4 == 'B') {
        plVar3 = spdlog::default_logger_raw();
        spdlog::source_loc::source_loc
                  (&local_310,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
                   ,0x94,"check_magic_number");
        loc_02.line = local_310.line;
        loc_02._12_4_ = local_310._12_4_;
        loc_02.filename = local_310.filename;
        loc_02.funcname = local_310.funcname;
        spdlog::logger::log<char[24],_0>
                  (plVar3,loc_02,debug,(char (*) [24])"Found BMP magic number.");
        filepath_local._7_1_ = -(local_2a3 == 'M') & 1;
      }
      else if (local_2a4 == -0x77) {
        plVar3 = spdlog::default_logger_raw();
        spdlog::source_loc::source_loc
                  (&local_2f8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
                   ,0x8d,"check_magic_number");
        loc_01.line = local_2f8.line;
        loc_01._12_4_ = local_2f8._12_4_;
        loc_01.filename = local_2f8.filename;
        loc_01.funcname = local_2f8.funcname;
        spdlog::logger::log<char[24],_0>
                  (plVar3,loc_01,debug,(char (*) [24])"Found PNG magic number.");
        iVar2 = strncmp(&local_2a4,anon_var_dwarf_13674f,8);
        filepath_local._7_1_ = -(iVar2 == 0) & 1;
      }
      else if (local_2a4 == -1) {
        plVar3 = spdlog::default_logger_raw();
        spdlog::source_loc::source_loc
                  (&local_2e0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
                   ,0x88,"check_magic_number");
        loc_00.line = local_2e0.line;
        loc_00._12_4_ = local_2e0._12_4_;
        loc_00.filename = local_2e0.filename;
        loc_00.funcname = local_2e0.funcname;
        spdlog::logger::log<char[25],_0>
                  (plVar3,loc_00,debug,(char (*) [25])"Found JPEG magic number.");
        iVar2 = strncmp(&local_2a4,anon_var_dwarf_13672f,3);
        filepath_local._7_1_ = -(iVar2 == 0) & 1;
      }
      else {
        plVar3 = spdlog::default_logger_raw();
        spdlog::source_loc::source_loc
                  (&local_328,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
                   ,0x98,"check_magic_number");
        loc_03.line = local_328.line;
        loc_03._12_4_ = local_328._12_4_;
        loc_03.filename = local_328.filename;
        loc_03.funcname = local_328.funcname;
        spdlog::logger::log<char[37],_0>
                  (plVar3,loc_03,debug,(char (*) [37])"Magic number unsupported or invalid.");
        filepath_local._7_1_ = 0;
      }
    }
    else {
      CLI::std::filesystem::__cxx11::path::string(&local_2c8,local_18);
      spdlog::warn<char[40],std::__cxx11::string>
                ((char (*) [40])"Could not read magic number for file {}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      filepath_local._7_1_ = 0;
    }
  }
  else {
    CLI::std::filesystem::__cxx11::path::string((string *)(buff + 4),local_18);
    spdlog::warn<char[23],std::__cxx11::string>
              ((char (*) [23])"Could not open file {}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(buff + 4));
    std::__cxx11::string::~string((string *)(buff + 4));
    filepath_local._7_1_ = 0;
  }
  buff[0] = '\x01';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  std::ifstream::~ifstream(&local_278);
  return (bool)(filepath_local._7_1_ & 1);
}

Assistant:

bool
check_magic_number(const std::filesystem::path& filepath)
{
    SPDLOG_DEBUG("Checking magic number for {}", filepath.string());

    std::ifstream input_file(filepath, std::ios_base::binary);
    if (!input_file) {
        spdlog::warn("Could not open file {}", filepath.string());
        return false;
    }

    std::uint8_t buff[MAGIC_NUMBER_BYTES];
    if (!input_file.read(reinterpret_cast<char*>(buff), sizeof(buff))) {
        spdlog::warn("Could not read magic number for file {}",
                     filepath.string());
        return false;
    }

    // Compare magic number
    switch (buff[0]) {
        case static_cast<std::uint8_t>('\xFF'):
            SPDLOG_DEBUG("Found JPEG magic number.");
            return (!strncmp((const char*)buff, "\xFF\xD8\xFF", 3)) ? true
                                                                    : false;

        case static_cast<std::uint8_t>('\x89'):
            SPDLOG_DEBUG("Found PNG magic number.");
            return (!strncmp(
                     (const char*)buff, "\x89\x50\x4E\x47\x0D\x0A\x1A\x0A", 8))
                     ? true
                     : false;

        case 'B':
            SPDLOG_DEBUG("Found BMP magic number.");
            return ((buff[1] == 'M')) ? true : false;
    }

    SPDLOG_DEBUG("Magic number unsupported or invalid.");

    return false;
}